

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_connection.c
# Opt level: O0

ngx_int_t ngx_set_inherited_sockets(ngx_cycle_t *cycle)

{
  short sVar1;
  ngx_log_t *pnVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  int local_3c;
  int local_38;
  int reuseport;
  ngx_err_t err;
  socklen_t olen;
  ngx_listening_t *ls;
  ngx_uint_t i;
  size_t len;
  ngx_cycle_t *cycle_local;
  
  _err = (cycle->listening).elts;
  ls = (ngx_listening_t *)0x0;
  len = (size_t)cycle;
  do {
    if (*(ngx_listening_t **)(len + 0xc0) <= ls) {
      return 0;
    }
    pvVar4 = ngx_palloc(*(ngx_pool_t **)(len + 8),0x70);
    *(void **)((long)_err + (long)ls * 0xe0 + 8) = pvVar4;
    if (*(long *)((long)_err + (long)ls * 0xe0 + 8) == 0) {
      return -1;
    }
    *(undefined4 *)((long)_err + (long)ls * 0xe0 + 0x10) = 0x70;
    iVar3 = getsockname(*(int *)((long)_err + (long)ls * 0xe0),
                        *(sockaddr **)((long)_err + (long)ls * 0xe0 + 8),
                        (socklen_t *)((long)_err + (long)ls * 0xe0 + 0x10));
    if (iVar3 == -1) {
      if (2 < **(ulong **)(len + 0x10)) {
        pnVar2 = *(ngx_log_t **)(len + 0x10);
        piVar5 = __errno_location();
        ngx_log_error_core(3,pnVar2,*piVar5,"getsockname() of the inherited socket #%d failed",
                           (ulong)*(uint *)((long)_err + (long)ls * 0xe0));
      }
      *(uint *)((long)_err + (long)ls * 0xe0 + 0xd8) =
           *(uint *)((long)_err + (long)ls * 0xe0 + 0xd8) & 0xfffffffb | 4;
    }
    else {
      if (0x70 < *(uint *)((long)_err + (long)ls * 0xe0 + 0x10)) {
        *(undefined4 *)((long)_err + (long)ls * 0xe0 + 0x10) = 0x70;
      }
      sVar1 = **(short **)((long)_err + (long)ls * 0xe0 + 8);
      if (sVar1 == 1) {
        *(undefined8 *)((long)_err + (long)ls * 0xe0 + 0x18) = 0x71;
        i = 0x71;
      }
      else if (sVar1 == 2) {
        *(undefined8 *)((long)_err + (long)ls * 0xe0 + 0x18) = 0xf;
        i = 0x15;
      }
      else {
        if (sVar1 != 10) {
          if (2 < **(ulong **)(len + 0x10)) {
            pnVar2 = *(ngx_log_t **)(len + 0x10);
            piVar5 = __errno_location();
            ngx_log_error_core(3,pnVar2,*piVar5,
                               "the inherited socket #%d has an unsupported protocol family",
                               (ulong)*(uint *)((long)_err + (long)ls * 0xe0));
          }
          *(uint *)((long)_err + (long)ls * 0xe0 + 0xd8) =
               *(uint *)((long)_err + (long)ls * 0xe0 + 0xd8) & 0xfffffffb | 4;
          goto LAB_0012cc33;
        }
        *(undefined8 *)((long)_err + (long)ls * 0xe0 + 0x18) = 0x2d;
        i = 0x35;
      }
      pvVar4 = ngx_pnalloc(*(ngx_pool_t **)(len + 8),i);
      *(void **)((long)_err + (long)ls * 0xe0 + 0x28) = pvVar4;
      if (*(long *)((long)_err + (long)ls * 0xe0 + 0x28) == 0) {
        return -1;
      }
      i = ngx_sock_ntop(*(sockaddr **)((long)_err + (long)ls * 0xe0 + 8),
                        *(socklen_t *)((long)_err + (long)ls * 0xe0 + 0x10),
                        *(u_char **)((long)_err + (long)ls * 0xe0 + 0x28),i,1);
      if (i == 0) {
        return -1;
      }
      *(ngx_uint_t *)((long)_err + (long)ls * 0xe0 + 0x20) = i;
      *(undefined4 *)((long)_err + (long)ls * 0xe0 + 0x34) = 0x1ff;
      reuseport = 4;
      iVar3 = getsockopt(*(int *)((long)_err + (long)ls * 0xe0),1,3,
                         (void *)((long)_err + (long)ls * 0xe0 + 0x30),(socklen_t *)&reuseport);
      if (iVar3 == -1) {
        if (2 < **(ulong **)(len + 0x10)) {
          pnVar2 = *(ngx_log_t **)(len + 0x10);
          piVar5 = __errno_location();
          ngx_log_error_core(3,pnVar2,*piVar5,"getsockopt(SO_TYPE) %V failed",
                             (long)_err + (long)ls * 0xe0 + 0x20);
        }
        *(uint *)((long)_err + (long)ls * 0xe0 + 0xd8) =
             *(uint *)((long)_err + (long)ls * 0xe0 + 0xd8) & 0xfffffffb | 4;
      }
      else {
        reuseport = 4;
        iVar3 = getsockopt(*(int *)((long)_err + (long)ls * 0xe0),1,8,
                           (void *)((long)_err + (long)ls * 0xe0 + 0x38),(socklen_t *)&reuseport);
        if (iVar3 == -1) {
          if (1 < **(ulong **)(len + 0x10)) {
            pnVar2 = *(ngx_log_t **)(len + 0x10);
            piVar5 = __errno_location();
            ngx_log_error_core(2,pnVar2,*piVar5,"getsockopt(SO_RCVBUF) %V failed, ignored",
                               (long)_err + (long)ls * 0xe0 + 0x20);
          }
          *(undefined4 *)((long)_err + (long)ls * 0xe0 + 0x38) = 0xffffffff;
        }
        reuseport = 4;
        iVar3 = getsockopt(*(int *)((long)_err + (long)ls * 0xe0),1,7,
                           (void *)((long)_err + (long)ls * 0xe0 + 0x3c),(socklen_t *)&reuseport);
        if (iVar3 == -1) {
          if (1 < **(ulong **)(len + 0x10)) {
            pnVar2 = *(ngx_log_t **)(len + 0x10);
            piVar5 = __errno_location();
            ngx_log_error_core(2,pnVar2,*piVar5,"getsockopt(SO_SNDBUF) %V failed, ignored",
                               (long)_err + (long)ls * 0xe0 + 0x20);
          }
          *(undefined4 *)((long)_err + (long)ls * 0xe0 + 0x3c) = 0xffffffff;
        }
        local_3c = 0;
        reuseport = 4;
        iVar3 = getsockopt(*(int *)((long)_err + (long)ls * 0xe0),1,0xf,&local_3c,
                           (socklen_t *)&reuseport);
        if (iVar3 == -1) {
          if (1 < **(ulong **)(len + 0x10)) {
            pnVar2 = *(ngx_log_t **)(len + 0x10);
            piVar5 = __errno_location();
            ngx_log_error_core(2,pnVar2,*piVar5,"getsockopt(SO_REUSEPORT) %V failed, ignored",
                               (long)_err + (long)ls * 0xe0 + 0x20);
          }
        }
        else {
          *(uint *)((long)_err + (long)ls * 0xe0 + 0xd8) =
               *(uint *)((long)_err + (long)ls * 0xe0 + 0xd8) & 0xffffefff |
               (uint)(local_3c != 0) << 0xc;
        }
        if (*(int *)((long)_err + (long)ls * 0xe0 + 0x30) == 1) {
          reuseport = 4;
          iVar3 = getsockopt(*(int *)((long)_err + (long)ls * 0xe0),6,0x17,
                             (void *)((long)_err + (long)ls * 0xe0 + 0xdc),(socklen_t *)&reuseport);
          if (iVar3 == -1) {
            piVar5 = __errno_location();
            local_38 = *piVar5;
            if (((local_38 != 0x5f) && (local_38 != 0x5c)) && (5 < **(ulong **)(len + 0x10))) {
              ngx_log_error_core(6,*(ngx_log_t **)(len + 0x10),local_38,
                                 "getsockopt(TCP_FASTOPEN) %V failed, ignored",
                                 (long)_err + (long)ls * 0xe0 + 0x20);
            }
            *(undefined4 *)((long)_err + (long)ls * 0xe0 + 0xdc) = 0xffffffff;
          }
        }
      }
    }
LAB_0012cc33:
    ls = (ngx_listening_t *)((long)&ls->fd + 1);
  } while( true );
}

Assistant:

ngx_int_t
ngx_set_inherited_sockets(ngx_cycle_t *cycle)
{
    size_t                     len;
    ngx_uint_t                 i;
    ngx_listening_t           *ls;
    socklen_t                  olen;
#if (NGX_HAVE_DEFERRED_ACCEPT || NGX_HAVE_TCP_FASTOPEN)
    ngx_err_t                  err;
#endif
#if (NGX_HAVE_DEFERRED_ACCEPT && defined SO_ACCEPTFILTER)
    struct accept_filter_arg   af;
#endif
#if (NGX_HAVE_DEFERRED_ACCEPT && defined TCP_DEFER_ACCEPT)
    int                        timeout;
#endif
#if (NGX_HAVE_REUSEPORT)
    int                        reuseport;
#endif

    ls = cycle->listening.elts;
    for (i = 0; i < cycle->listening.nelts; i++) {

        ls[i].sockaddr = ngx_palloc(cycle->pool, sizeof(ngx_sockaddr_t));
        if (ls[i].sockaddr == NULL) {
            return NGX_ERROR;
        }

        ls[i].socklen = sizeof(ngx_sockaddr_t);
        if (getsockname(ls[i].fd, ls[i].sockaddr, &ls[i].socklen) == -1) {
            ngx_log_error(NGX_LOG_CRIT, cycle->log, ngx_socket_errno,
                          "getsockname() of the inherited "
                          "socket #%d failed", ls[i].fd);
            ls[i].ignore = 1;
            continue;
        }

        if (ls[i].socklen > (socklen_t) sizeof(ngx_sockaddr_t)) {
            ls[i].socklen = sizeof(ngx_sockaddr_t);
        }

        switch (ls[i].sockaddr->sa_family) {

#if (NGX_HAVE_INET6)
        case AF_INET6:
            ls[i].addr_text_max_len = NGX_INET6_ADDRSTRLEN;
            len = NGX_INET6_ADDRSTRLEN + sizeof("[]:65535") - 1;
            break;
#endif

#if (NGX_HAVE_UNIX_DOMAIN)
        case AF_UNIX:
            ls[i].addr_text_max_len = NGX_UNIX_ADDRSTRLEN;
            len = NGX_UNIX_ADDRSTRLEN;
            break;
#endif

        case AF_INET:
            ls[i].addr_text_max_len = NGX_INET_ADDRSTRLEN;
            len = NGX_INET_ADDRSTRLEN + sizeof(":65535") - 1;
            break;

        default:
            ngx_log_error(NGX_LOG_CRIT, cycle->log, ngx_socket_errno,
                          "the inherited socket #%d has "
                          "an unsupported protocol family", ls[i].fd);
            ls[i].ignore = 1;
            continue;
        }

        ls[i].addr_text.data = ngx_pnalloc(cycle->pool, len);
        if (ls[i].addr_text.data == NULL) {
            return NGX_ERROR;
        }

        len = ngx_sock_ntop(ls[i].sockaddr, ls[i].socklen,
                            ls[i].addr_text.data, len, 1);
        if (len == 0) {
            return NGX_ERROR;
        }

        ls[i].addr_text.len = len;

        ls[i].backlog = NGX_LISTEN_BACKLOG;

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_TYPE, (void *) &ls[i].type,
                       &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_CRIT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_TYPE) %V failed", &ls[i].addr_text);
            ls[i].ignore = 1;
            continue;
        }

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_RCVBUF, (void *) &ls[i].rcvbuf,
                       &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_RCVBUF) %V failed, ignored",
                          &ls[i].addr_text);

            ls[i].rcvbuf = -1;
        }

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_SNDBUF, (void *) &ls[i].sndbuf,
                       &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_SNDBUF) %V failed, ignored",
                          &ls[i].addr_text);

            ls[i].sndbuf = -1;
        }

#if 0
        /* SO_SETFIB is currently a set only option */

#if (NGX_HAVE_SETFIB)

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_SETFIB,
                       (void *) &ls[i].setfib, &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_SETFIB) %V failed, ignored",
                          &ls[i].addr_text);

            ls[i].setfib = -1;
        }

#endif
#endif

#if (NGX_HAVE_REUSEPORT)

        reuseport = 0;
        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_REUSEPORT,
                       (void *) &reuseport, &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_REUSEPORT) %V failed, ignored",
                          &ls[i].addr_text);

        } else {
            ls[i].reuseport = reuseport ? 1 : 0;
        }

#endif

        if (ls[i].type != SOCK_STREAM) {
            continue;
        }

#if (NGX_HAVE_TCP_FASTOPEN)

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, IPPROTO_TCP, TCP_FASTOPEN,
                       (void *) &ls[i].fastopen, &olen)
            == -1)
        {
            err = ngx_socket_errno;

            if (err != NGX_EOPNOTSUPP && err != NGX_ENOPROTOOPT) {
                ngx_log_error(NGX_LOG_NOTICE, cycle->log, err,
                              "getsockopt(TCP_FASTOPEN) %V failed, ignored",
                              &ls[i].addr_text);
            }

            ls[i].fastopen = -1;
        }

#endif

#if (NGX_HAVE_DEFERRED_ACCEPT && defined SO_ACCEPTFILTER)

        ngx_memzero(&af, sizeof(struct accept_filter_arg));
        olen = sizeof(struct accept_filter_arg);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_ACCEPTFILTER, &af, &olen)
            == -1)
        {
            err = ngx_socket_errno;

            if (err == NGX_EINVAL) {
                continue;
            }

            ngx_log_error(NGX_LOG_NOTICE, cycle->log, err,
                          "getsockopt(SO_ACCEPTFILTER) for %V failed, ignored",
                          &ls[i].addr_text);
            continue;
        }

        if (olen < sizeof(struct accept_filter_arg) || af.af_name[0] == '\0') {
            continue;
        }

        ls[i].accept_filter = ngx_palloc(cycle->pool, 16);
        if (ls[i].accept_filter == NULL) {
            return NGX_ERROR;
        }

        (void) ngx_cpystrn((u_char *) ls[i].accept_filter,
                           (u_char *) af.af_name, 16);
#endif

#if (NGX_HAVE_DEFERRED_ACCEPT && defined TCP_DEFER_ACCEPT)

        timeout = 0;
        olen = sizeof(int);

        if (getsockopt(ls[i].fd, IPPROTO_TCP, TCP_DEFER_ACCEPT, &timeout, &olen)
            == -1)
        {
            err = ngx_socket_errno;

            if (err == NGX_EOPNOTSUPP) {
                continue;
            }

            ngx_log_error(NGX_LOG_NOTICE, cycle->log, err,
                          "getsockopt(TCP_DEFER_ACCEPT) for %V failed, ignored",
                          &ls[i].addr_text);
            continue;
        }

        if (olen < sizeof(int) || timeout == 0) {
            continue;
        }

        ls[i].deferred_accept = 1;
#endif
    }

    return NGX_OK;
}